

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgException.h
# Opt level: O0

string * __thiscall
TCLAP::ArgException::argId_abi_cxx11_(string *__return_storage_ptr__,ArgException *this)

{
  bool bVar1;
  allocator<char> local_19;
  ArgException *local_18;
  ArgException *this_local;
  
  local_18 = this;
  this_local = (ArgException *)__return_storage_ptr__;
  bVar1 = std::operator==(&this->_argId,"undefined");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__," ",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    std::operator+(__return_storage_ptr__,"Argument: ",&this->_argId);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string argId() const  
		{ 
			if ( _argId == "undefined" )
				return " ";
			else
				return ( "Argument: " + _argId ); 
		}